

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

int __thiscall
cs_impl::any::clone(any *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int iVar1;
  undefined4 extraout_var;
  proxy *ppVar2;
  proxy *extraout_RAX;
  error *this_00;
  string local_38;
  
  ppVar2 = this->mDat;
  if (ppVar2 != (proxy *)0x0) {
    if (2 < ppVar2->protect_level) {
      this_00 = (error *)__cxa_allocate_exception(0x28,__fn,__child_stack,___flags);
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"E000L","");
      cov::error::error(this_00,&local_38);
      __cxa_throw(this_00,&cov::error::typeinfo,cov::error::~error);
    }
    iVar1 = (*ppVar2->data->_vptr_baseHolder[3])();
    if ((DAT_00339e90 == 0) || (cs::global_thread_counter != 0)) {
      ppVar2 = (proxy *)operator_new(0x18);
    }
    else {
      ppVar2 = (proxy *)(&cs::null_pointer)[DAT_00339e90];
      DAT_00339e90 = DAT_00339e90 + -1;
    }
    ppVar2->is_rvalue = false;
    ppVar2->protect_level = 0;
    ppVar2->refcount = 1;
    ppVar2->data = (baseHolder *)CONCAT44(extraout_var,iVar1);
    recycle(this);
    this->mDat = ppVar2;
    ppVar2 = extraout_RAX;
  }
  return (int)ppVar2;
}

Assistant:

void clone()
		{
			if (mDat != nullptr) {
				if (mDat->protect_level > 2)
					throw cov::error("E000L");
				proxy *dat = allocator.alloc(1, mDat->data->duplicate());
				recycle();
				mDat = dat;
			}
		}